

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_interpolation.c
# Opt level: O0

double filter_hamming(double x)

{
  double x_local;
  
  if (-1.0 <= x) {
    if (0.0 <= x) {
      if (1.0 <= x) {
        x_local = 0.0;
      }
      else {
        x_local = (x + x + -3.0) * 0.9200000166893005 * x * x + 1.0;
      }
    }
    else {
      x_local = (-3.0 - (x + x)) * 0.9200000166893005 * x * x + 1.0;
    }
  }
  else {
    x_local = 0.0;
  }
  return x_local;
}

Assistant:

static double filter_hamming(const double x)
{
	/* should be
	(0.54+0.46*cos(M_PI*(double) x));
	but this approximation is sufficient */
	if (x < -1.0f)
		return 0.0f;
	if (x < 0.0f)
		return 0.92f*(-2.0f*x-3.0f)*x*x+1.0f;
	if (x < 1.0f)
		return 0.92f*(2.0f*x-3.0f)*x*x+1.0f;
	return 0.0f;
}